

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneParser.cpp
# Opt level: O1

Plane * __thiscall SceneParser::parsePlane(SceneParser *this)

{
  Material *m;
  Plane *this_00;
  float d;
  Vector3f normal;
  char token [100];
  short local_78;
  undefined1 uStack_76;
  undefined1 uStack_75;
  
  getToken(this,(char *)&stack0xffffffffffffff88);
  if (local_78 != 0x7b) {
    __assert_fail("!strcmp(token, \"{\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x166,"Plane *SceneParser::parsePlane()");
  }
  getToken(this,(char *)&stack0xffffffffffffff88);
  if (_uStack_75 != 0x6c616d || CONCAT13(uStack_75,CONCAT12(uStack_76,local_78)) != 0x6d726f6e) {
    __assert_fail("!strcmp(token, \"normal\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x168,"Plane *SceneParser::parsePlane()");
  }
  readVector3f((SceneParser *)&stack0xffffffffffffff7c);
  getToken(this,(char *)&stack0xffffffffffffff88);
  if (_uStack_75 != 0x746573 || CONCAT13(uStack_75,CONCAT12(uStack_76,local_78)) != 0x7366666f) {
    __assert_fail("!strcmp(token, \"offset\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x16b,"Plane *SceneParser::parsePlane()");
  }
  d = readFloat(this);
  getToken(this,(char *)&stack0xffffffffffffff88);
  if (local_78 == 0x7d) {
    m = this->_current_material;
    if (m != (Material *)0x0) {
      this_00 = (Plane *)operator_new(0x40);
      Plane::Plane(this_00,(Vector3f *)&stack0xffffffffffffff7c,d,m);
      return this_00;
    }
    __assert_fail("_current_material != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x16f,"Plane *SceneParser::parsePlane()");
  }
  __assert_fail("!strcmp(token, \"}\")",
                "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                ,0x16e,"Plane *SceneParser::parsePlane()");
}

Assistant:

Plane *
SceneParser::parsePlane() {
    char token[MAX_PARSER_TOKEN_LENGTH];
    getToken(token);
    assert(!strcmp(token, "{"));
    getToken(token);
    assert(!strcmp(token, "normal"));
    Vector3f normal = readVector3f();
    getToken(token);
    assert(!strcmp(token, "offset"));
    float offset = readFloat();
    getToken(token);
    assert(!strcmp(token, "}"));
    assert(_current_material != NULL);
    return new Plane(normal, offset, _current_material);
}